

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

void __thiscall
de::ArrayBuffer<unsigned_int,_4UL,_4UL>::swap
          (ArrayBuffer<unsigned_int,_4UL,_4UL> *this,ArrayBuffer<unsigned_int,_4UL,_4UL> *other)

{
  void *pvVar1;
  size_t sVar2;
  size_t otherCap;
  void *otherPtr;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *other_local;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *this_local;
  
  pvVar1 = other->m_ptr;
  sVar2 = other->m_cap;
  other->m_ptr = this->m_ptr;
  other->m_cap = this->m_cap;
  this->m_ptr = pvVar1;
  this->m_cap = sVar2;
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::swap (ArrayBuffer& other) throw()
{
	void* const		otherPtr = other.m_ptr;
	const size_t	otherCap = other.m_cap;

	other.m_ptr = m_ptr;
	other.m_cap = m_cap;
	m_ptr		= otherPtr;
	m_cap		= otherCap;
}